

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TextureSwizzle::FunctionalTest::fillSourceTexture
          (FunctionalTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  long lVar5;
  undefined4 extraout_var;
  TestError *this_00;
  char *msg;
  long lVar7;
  long lVar6;
  
  iVar1 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  lVar5 = format_idx * 0x78;
  iVar3 = (*((this->super_SmokeTest).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])
                    ();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0xb8))(iVar1,(this->super_SmokeTest).m_source_tex_id);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xfc2);
  if (iVar1 == 0xde0) {
    (**(code **)(lVar6 + 0x13b0))
              (0xde0,0,0,1,*(undefined4 *)(&DAT_01e7a2c8 + lVar5),
               *(undefined4 *)(&DAT_01e7a2cc + lVar5),*(undefined8 *)(&DAT_01e7a320 + lVar5));
    dVar4 = (**(code **)(lVar6 + 0x800))();
    msg = "TexSubImage1D";
    iVar3 = 0xfca;
LAB_00929bd0:
    glu::checkError(dVar4,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,iVar3);
  }
  else {
    if (iVar1 == 0xde1) {
LAB_00929ade:
      (**(code **)(lVar6 + 0x13b8))
                (iVar1,0,0,0,1,1,*(undefined4 *)(&DAT_01e7a2c8 + lVar5),
                 *(undefined4 *)(&DAT_01e7a2cc + lVar5),*(undefined8 *)(&DAT_01e7a320 + lVar5));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      msg = "TexSubImage2D";
      iVar3 = 0xfd3;
      goto LAB_00929bd0;
    }
    if (iVar1 == 0x806f) {
LAB_00929b2c:
      (**(code **)(lVar6 + 0x13c0))
                (iVar1,0,0,0,0,1,1,1,*(undefined4 *)(&DAT_01e7a2c8 + lVar5),
                 *(undefined4 *)(&DAT_01e7a2cc + lVar5),*(undefined8 *)(&DAT_01e7a320 + lVar5));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      msg = "TexSubImage3D";
      iVar3 = 0xfdb;
      goto LAB_00929bd0;
    }
    if (iVar1 == 0x84f5) goto LAB_00929ade;
    if (iVar1 == 0x9102) {
LAB_00929b7b:
      bVar2 = fillMSTexture(this,format_idx,target_idx);
      goto LAB_00929bd8;
    }
    if (iVar1 == 0x8c18) goto LAB_00929ade;
    if (iVar1 == 0x8c1a) goto LAB_00929b2c;
    if (iVar1 == 0x9100) goto LAB_00929b7b;
    if (iVar1 != 0x8513) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                 ,0xff0);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
      (**(code **)(lVar6 + 0x13b8))
                (*(undefined4 *)((long)&cube_map_faces + lVar7),0,0,0,1,1,
                 *(undefined4 *)(&DAT_01e7a2c8 + lVar5),*(undefined4 *)(&DAT_01e7a2cc + lVar5),
                 *(undefined8 *)(&DAT_01e7a320 + lVar5));
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"TexSubImage2D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                      ,0xfe4);
    }
  }
  bVar2 = true;
LAB_00929bd8:
  (**(code **)(lVar6 + 0xb8))(iVar1,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xff6);
  return bVar2;
}

Assistant:

bool FunctionalTest::fillSourceTexture(size_t format_idx, size_t target_idx)
{
	const glw::GLenum	  target = texture_targets[target_idx].m_target;
	const _texture_format& format = texture_formats[format_idx];

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result */
	bool result = true;

	/* Bind texture */
	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Attach texture */
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texSubImage1D(target, 0 /* level */, 0 /* x */, m_width, format.m_format, format.m_type,
						 format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage1D");

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texSubImage2D(target, 0 /* level */, 0 /* x */, 0 /* y */, m_width, m_height, format.m_format, format.m_type,
						 format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texSubImage3D(target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, m_width, m_height, m_depth,
						 format.m_format, format.m_type, format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage3D");

		break;

	case GL_TEXTURE_CUBE_MAP:
		for (size_t i = 0; i < n_cube_map_faces; ++i)
		{
			gl.texSubImage2D(cube_map_faces[i], 0 /* level */, 0 /* x */, 0 /* y */, m_width, m_height, format.m_format,
							 format.m_type, format.m_source_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");
		}

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		result = fillMSTexture(format_idx, target_idx);

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Unbind */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Done */
	return result;
}